

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_dynamic.cpp
# Opt level: O2

void multikey_dynamic<vector_brodnik<unsigned_char*>,unsigned_char>
               (uchar **strings,size_t N,size_t depth)

{
  byte bVar1;
  uchar uVar2;
  byte bVar3;
  size_t N_00;
  long lVar4;
  size_t N_01;
  size_t N_02;
  uchar **t;
  long lVar5;
  ulong uVar6;
  long lVar7;
  uint j;
  long lVar8;
  uchar **t_00;
  long lVar9;
  uint j_1;
  long lVar10;
  array<vector_brodnik<unsigned_char_*>,_3UL> buckets;
  array<unsigned_char,_32UL> cache;
  
  if (N < 10000) {
    mkqsort(strings,(int)N,(int)depth);
    return;
  }
  std::array<vector_brodnik<unsigned_char_*>,_3UL>::array(&buckets);
  bVar1 = pseudo_median<unsigned_char>(strings,N,depth);
  t = strings;
  for (uVar6 = 0; uVar6 < (N & 0xffffffffffffffe0); uVar6 = uVar6 + 0x20) {
    for (lVar8 = 0; lVar8 != 0x20; lVar8 = lVar8 + 1) {
      uVar2 = get_char<unsigned_char>(t[lVar8],depth);
      cache._M_elems[lVar8] = uVar2;
    }
    t_00 = t;
    for (lVar8 = 0; lVar8 != 0x20; lVar8 = lVar8 + 1) {
      vector_brodnik<unsigned_char_*>::push_back
                (buckets._M_elems +
                 (ulong)(cache._M_elems[lVar8] == bVar1) +
                 (ulong)(bVar1 < cache._M_elems[lVar8]) * 2,t_00);
      t_00 = t_00 + 1;
    }
    t = t + 0x20;
  }
  for (; uVar6 < N; uVar6 = uVar6 + 1) {
    bVar3 = get_char<unsigned_char>(*t,depth);
    vector_brodnik<unsigned_char_*>::push_back
              (buckets._M_elems +
               (ulong)(bVar3 == bVar1) + (ulong)(bVar1 <= bVar3 && bVar3 != bVar1) * 2,t);
    t = t + 1;
  }
  lVar4 = (long)(2 << (buckets._M_elems[0]._superblock & 0x1f)) + -0x40;
  lVar8 = buckets._M_elems[0]._left_in_superblock * buckets._M_elems[0]._block_size +
          buckets._M_elems[0]._left_in_block;
  N_00 = lVar4 - lVar8;
  lVar10 = buckets._M_elems[1]._left_in_superblock * buckets._M_elems[1]._block_size +
           buckets._M_elems[1]._left_in_block;
  lVar7 = (long)(2 << (buckets._M_elems[1]._superblock & 0x1f)) + -0x40;
  N_02 = lVar7 - lVar10;
  lVar5 = (long)(2 << (buckets._M_elems[2]._superblock & 0x1f)) + -0x40;
  lVar9 = buckets._M_elems[2]._left_in_superblock * buckets._M_elems[2]._block_size +
          buckets._M_elems[2]._left_in_block;
  N_01 = lVar5 - lVar9;
  if (N_00 + N_02 + N_01 != N) {
    __assert_fail("bucketsize0 + bucketsize1 + bucketsize2 == N",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_dynamic.cpp"
                  ,0x5d,
                  "void multikey_dynamic(unsigned char **, size_t, size_t) [BucketT = vector_brodnik<unsigned char *>, CharT = unsigned char]"
                 );
  }
  if (lVar4 != lVar8) {
    copy<unsigned_char*,unsigned_char**>(buckets._M_elems,strings);
  }
  if (lVar7 != lVar10) {
    copy<unsigned_char*,unsigned_char**>(buckets._M_elems + 1,strings + N_00);
  }
  if (lVar5 != lVar9) {
    copy<unsigned_char*,unsigned_char**>(buckets._M_elems + 2,strings + N_00 + N_02);
  }
  vector_brodnik<unsigned_char_*>::clear(buckets._M_elems);
  vector_brodnik<unsigned_char_*>::clear(buckets._M_elems + 1);
  vector_brodnik<unsigned_char_*>::clear(buckets._M_elems + 2);
  multikey_dynamic<vector_brodnik<unsigned_char*>,unsigned_char>(strings,N_00,depth);
  if (bVar1 != 0) {
    multikey_dynamic<vector_brodnik<unsigned_char*>,unsigned_char>(strings + N_00,N_02,depth + 1);
  }
  multikey_dynamic<vector_brodnik<unsigned_char*>,unsigned_char>(strings + N_00 + N_02,N_01,depth);
  std::array<vector_brodnik<unsigned_char_*>,_3UL>::~array(&buckets);
  return;
}

Assistant:

static void
multikey_dynamic(unsigned char** strings, size_t N, size_t depth)
{
	if (N < 10000) {
		mkqsort(strings, N, depth);
		return;
	}
	std::array<BucketT, 3> buckets;
	CharT partval = pseudo_median<CharT>(strings, N, depth);
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < N-N%32; i+=32) {
		std::array<CharT, 32> cache;
		for (unsigned j=0; j<32; ++j) {
			cache[j] = get_char<CharT>(strings[i+j], depth);
		}
		for (unsigned j=0; j<32; ++j) {
			const unsigned b = get_bucket(cache[j], partval);
			buckets[b].push_back(strings[i+j]);
		}
	}
	for (; i < N; ++i) {
		const CharT c = get_char<CharT>(strings[i], depth);
		const unsigned b = get_bucket(c, partval);
		buckets[b].push_back(strings[i]);
	}
	const size_t bucketsize0 = buckets[0].size();
	const size_t bucketsize1 = buckets[1].size();
	const size_t bucketsize2 = buckets[2].size();
	assert(bucketsize0 + bucketsize1 + bucketsize2 == N);
	if (bucketsize0) copy(buckets[0], strings);
	if (bucketsize1) copy(buckets[1], strings+bucketsize0);
	if (bucketsize2) copy(buckets[2], strings+bucketsize0+bucketsize1);
	clear_bucket(buckets[0]);
	clear_bucket(buckets[1]);
	clear_bucket(buckets[2]);
	multikey_dynamic<BucketT, CharT>(strings, bucketsize0, depth);
	if (not is_end(partval))
		multikey_dynamic<BucketT, CharT>(strings+bucketsize0,
				bucketsize1, depth+sizeof(CharT));
	multikey_dynamic<BucketT, CharT>(strings+bucketsize0+bucketsize1,
			bucketsize2, depth);
}